

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::AV1Convolve2DHighbdCompoundTest::~AV1Convolve2DHighbdCompoundTest
          (AV1Convolve2DHighbdCompoundTest *this)

{
  anon_unknown.dwarf_e304c3::AV1Convolve2DHighbdCompoundTest::~AV1Convolve2DHighbdCompoundTest
            ((AV1Convolve2DHighbdCompoundTest *)(this + -0x10));
  return;
}

Assistant:

void RunTest() {
    auto compound_params = GetCompoundParams();
    for (int h_f = EIGHTTAP_REGULAR; h_f < INTERP_FILTERS_ALL; ++h_f) {
      for (int v_f = EIGHTTAP_REGULAR; v_f < INTERP_FILTERS_ALL; ++v_f) {
        // Do not test the no-op filter.
        for (int sub_x = 1; sub_x < 16; ++sub_x) {
          for (int sub_y = 1; sub_y < 16; ++sub_y) {
            for (const auto &compound : compound_params) {
              TestConvolve(static_cast<InterpFilter>(h_f),
                           static_cast<InterpFilter>(v_f), sub_x, sub_y,
                           compound);
            }
          }
        }
      }
    }
  }